

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

ostream * glu::decl::operator<<(ostream *str,DeclareVariable *decl)

{
  int iVar1;
  bool bVar2;
  Precision PVar3;
  DataType dataType;
  char *pcVar4;
  ostream *poVar5;
  reference piVar6;
  DeclareStructTypePtr DVar7;
  iterator iStack_90;
  int arrSize;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  const_iterator sizeIter;
  DeclareStructTypePtr local_68;
  StructType *local_58;
  StructType *structPtr;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> arraySizes;
  VarType *curType;
  VarType *type;
  DeclareVariable *decl_local;
  ostream *str_local;
  
  arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)decl;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  while (bVar2 = VarType::isArrayType
                           ((VarType *)
                            arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), bVar2) {
    structPtr._0_4_ =
         VarType::getArraySize
                   ((VarType *)
                    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,(value_type_conflict1 *)&structPtr);
    arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)VarType::getElementType
                            ((VarType *)
                             arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  }
  bVar2 = VarType::isBasicType
                    ((VarType *)
                     arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    PVar3 = VarType::getPrecision
                      ((VarType *)
                       arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (PVar3 != PRECISION_LAST) {
      PVar3 = VarType::getPrecision
                        ((VarType *)
                         arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      pcVar4 = getPrecisionName(PVar3);
      poVar5 = std::operator<<(str,pcVar4);
      std::operator<<(poVar5," ");
    }
    dataType = VarType::getBasicType
                         ((VarType *)
                          arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    pcVar4 = getDataTypeName(dataType);
    std::operator<<(str,pcVar4);
  }
  else {
    bVar2 = VarType::isStructType
                      ((VarType *)
                       arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      local_58 = VarType::getStructPtr
                           ((VarType *)
                            arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      bVar2 = StructType::hasTypeName(local_58);
      if (bVar2) {
        pcVar4 = StructType::getTypeName(local_58);
        std::operator<<(str,pcVar4);
      }
      else {
        DVar7 = declare(local_58,decl->indentLevel);
        sizeIter._M_current = (int *)DVar7.structPtr;
        local_68.indentLevel = DVar7.indentLevel;
        local_68.structPtr = (StructType *)sizeIter._M_current;
        operator<<(str,&local_68);
      }
    }
  }
  poVar5 = std::operator<<(str," ");
  std::operator<<(poVar5,(string *)&decl->name);
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_40);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_80,
             &local_88);
  while( true ) {
    iStack_90 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_40);
    bVar2 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff70);
    if (!bVar2) break;
    piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_80);
    iVar1 = *piVar6;
    if (iVar1 == -1) {
      std::operator<<(str,"[]");
    }
    else {
      poVar5 = std::operator<<(str,"[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
      std::operator<<(poVar5,"]");
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_80,0);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareVariable& decl)
{
	const VarType&		type	= decl.varType;
	const VarType*		curType	= &type;
	std::vector<int>	arraySizes;

	// Handle arrays.
	while (curType->isArrayType())
	{
		arraySizes.push_back(curType->getArraySize());
		curType = &curType->getElementType();
	}

	if (curType->isBasicType())
	{
		if (curType->getPrecision() != PRECISION_LAST)
			str << glu::getPrecisionName(curType->getPrecision()) << " ";
		str << glu::getDataTypeName(curType->getBasicType());
	}
	else if (curType->isStructType())
	{
		const StructType* structPtr = curType->getStructPtr();

		if (structPtr->hasTypeName())
			str << structPtr->getTypeName();
		else
			str << declare(structPtr, decl.indentLevel); // Generate inline declaration.
	}
	else
		DE_ASSERT(false);

	str << " " << decl.name;

	// Print array sizes.
	for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
	{
		const int arrSize = *sizeIter;
		if (arrSize == VarType::UNSIZED_ARRAY)
			str << "[]";
		else
			str << "[" << arrSize << "]";
	}

	return str;
}